

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca.cpp
# Opt level: O3

void initLCA(int root,int n)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  pred[root][0] = -1;
  d[root] = 0;
  dfs(root);
  lVar1 = 1;
  lVar2 = 0x210aa4;
  do {
    if (0 < n) {
      lVar3 = 0;
      do {
        lVar5 = (long)*(int *)(lVar2 + -4 + lVar3);
        if (lVar5 == -1) {
          iVar4 = -1;
        }
        else {
          iVar4 = pred[lVar5 + -1][lVar1 + 0x13];
        }
        *(int *)(lVar2 + lVar3) = iVar4;
        lVar3 = lVar3 + 0x50;
      } while ((ulong)(uint)n * 0x50 != lVar3);
    }
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + 4;
  } while (lVar1 != 0x14);
  return;
}

Assistant:

void initLCA(int root, int n = N) {
    pred[root][0] = -1, d[root] = 0;
    dfs(root);
    rep(l, 1, LOG) rep(i, 0, n) {
        if (pred[i][l - 1] == -1) pred[i][l] = -1;
        else pred[i][l] = pred[pred[i][l - 1]][l - 1];
    }
}